

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::Duration::_InternalSerialize
          (Duration *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int32_t value;
  long value_00;
  ulong uVar1;
  uint8_t *puVar2;
  
  if (((undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x1) !=
       (undefined1  [24])0x0) && (value_00 = (this->field_0)._impl_.seconds_, value_00 != 0)) {
    target = protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>
                       (stream,value_00,target);
  }
  if (((undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x2) !=
       (undefined1  [24])0x0) && (value = (this->field_0)._impl_.nanos_, value != 0)) {
    target = protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(stream,value,target);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar2 = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Duration::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Duration& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Duration)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // int64 seconds = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (this_._internal_seconds() != 0) {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>(
              stream, this_._internal_seconds(), target);
    }
  }

  // int32 nanos = 2;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (this_._internal_nanos() != 0) {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
              stream, this_._internal_nanos(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Duration)
  return target;
}